

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O0

CURLcode randit(Curl_easy *data,uint *rnd)

{
  int __fd;
  ssize_t sVar1;
  curltime cVar2;
  uint r;
  curltime now;
  ssize_t nread;
  int fd;
  CURLcode result;
  uint *rnd_local;
  Curl_easy *data_local;
  
  data_local._4_4_ = Curl_ssl_random(data,(uchar *)rnd,4);
  if (data_local._4_4_ == CURLE_NOT_BUILT_IN) {
    if (((randit::seeded & 1U) == 0) && (__fd = open64("/dev/urandom",0), -1 < __fd)) {
      sVar1 = read(__fd,&randit::randseed,4);
      if (sVar1 == 4) {
        randit::seeded = true;
      }
      close(__fd);
    }
    if ((randit::seeded & 1U) == 0) {
      cVar2 = Curl_now();
      if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
        Curl_infof(data,"WARNING: using weak random seed");
      }
      randit::randseed =
           (((cVar2.tv_usec + (int)cVar2.tv_sec + randit::randseed) * 0x41c64e6d + 0x3039) *
            0x41c64e6d + 0x3039) * 0x41c64e6d + 0x3039;
      randit::seeded = true;
    }
    randit::randseed = randit::randseed * 0x41c64e6d + 0x3039;
    *rnd = randit::randseed * 0x10000 | randit::randseed >> 0x10;
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode randit(struct Curl_easy *data, unsigned int *rnd)
{
  CURLcode result = CURLE_OK;
  static unsigned int randseed;
  static bool seeded = FALSE;

#ifdef CURLDEBUG
  char *force_entropy = getenv("CURL_ENTROPY");
  if(force_entropy) {
    if(!seeded) {
      unsigned int seed = 0;
      size_t elen = strlen(force_entropy);
      size_t clen = sizeof(seed);
      size_t min = elen < clen ? elen : clen;
      memcpy((char *)&seed, force_entropy, min);
      randseed = ntohl(seed);
      seeded = TRUE;
    }
    else
      randseed++;
    *rnd = randseed;
    return CURLE_OK;
  }
#endif

  /* data may be NULL! */
  result = Curl_ssl_random(data, (unsigned char *)rnd, sizeof(*rnd));
  if(result != CURLE_NOT_BUILT_IN)
    /* only if there is no random function in the TLS backend do the non crypto
       version, otherwise return result */
    return result;

  /* ---- non-cryptographic version following ---- */

#ifdef _WIN32
  if(!seeded) {
    result = Curl_win32_random((unsigned char *)rnd, sizeof(*rnd));
    if(result != CURLE_NOT_BUILT_IN)
      return result;
  }
#endif

#if defined(HAVE_ARC4RANDOM) && !defined(USE_OPENSSL)
  if(!seeded) {
    *rnd = (unsigned int)arc4random();
    return CURLE_OK;
  }
#endif

#if defined(RANDOM_FILE) && !defined(_WIN32)
  if(!seeded) {
    /* if there's a random file to read a seed from, use it */
    int fd = open(RANDOM_FILE, O_RDONLY);
    if(fd > -1) {
      /* read random data into the randseed variable */
      ssize_t nread = read(fd, &randseed, sizeof(randseed));
      if(nread == sizeof(randseed))
        seeded = TRUE;
      close(fd);
    }
  }
#endif

  if(!seeded) {
    struct curltime now = Curl_now();
    infof(data, "WARNING: using weak random seed");
    randseed += (unsigned int)now.tv_usec + (unsigned int)now.tv_sec;
    randseed = randseed * 1103515245 + 12345;
    randseed = randseed * 1103515245 + 12345;
    randseed = randseed * 1103515245 + 12345;
    seeded = TRUE;
  }

  {
    unsigned int r;
    /* Return an unsigned 32-bit pseudo-random number. */
    r = randseed = randseed * 1103515245 + 12345;
    *rnd = (r << 16) | ((r >> 16) & 0xFFFF);
  }
  return CURLE_OK;
}